

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawImage::Tick
          (CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  ABasicArmor *item_00;
  AWeapon *item_01;
  APlayerPawn *this_00;
  bool bVar1;
  int iVar2;
  FTexture *pFVar3;
  PClassActor *type;
  AInventory *pAVar4;
  AHexenArmor *pAVar5;
  double dVar6;
  bool local_79;
  AHexenArmor *harmor;
  int armorType;
  AInventory *item;
  AWeapon *weapon;
  ABasicArmor *armor;
  AAmmo *ammo_1;
  AAmmo *ammo;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawImage *this_local;
  
  SBarInfoCommandFlowControl::Tick
            (&this->super_SBarInfoCommandFlowControl,block,statusBar,hudChanged);
  this->texture = (FTexture *)0x0;
  this->alpha = 1.0;
  if ((this->applyscale & 1U) != 0) {
    this->spawnScaleY = 1.0;
    this->spawnScaleX = 1.0;
    this->applyscale = false;
  }
  if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 0) {
    pFVar3 = FTextureManager::operator()
                       (&TexMan,(FTextureID)
                                (((statusBar->super_DBaseStatusBar).CPlayer)->mo->ScoreIcon).texnum,
                        false);
    this->texture = pFVar3;
  }
  else if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 1) {
    if (statusBar->ammo1 != (AAmmo *)0x0) {
      GetIcon(this,&statusBar->ammo1->super_AInventory);
    }
  }
  else if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 2) {
    if (statusBar->ammo2 != (AAmmo *)0x0) {
      GetIcon(this,&statusBar->ammo2->super_AInventory);
    }
  }
  else if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 3) {
    item_00 = statusBar->armor;
    if ((item_00 != (ABasicArmor *)0x0) && ((item_00->super_AArmor).super_AInventory.Amount != 0)) {
      GetIcon(this,(AInventory *)item_00);
    }
  }
  else if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 4) {
    item_01 = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon;
    if (item_01 != (AWeapon *)0x0) {
      GetIcon(this,(AInventory *)item_01);
    }
  }
  else if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 5) {
    this_00 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    type = PClass::FindActor(NAME_Sigil);
    pAVar4 = AActor::FindInventory(&this_00->super_AActor,type,false);
    if (pAVar4 != (AInventory *)0x0) {
      pFVar3 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar4->Icon).texnum,false);
      this->texture = pFVar3;
    }
  }
  else if ((((*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 6) ||
            (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 7)) ||
           (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 8)) ||
          (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 9)) {
    iVar2 = *(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 + -6;
    pAVar5 = AActor::FindInventory<AHexenArmor>
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
    if (pAVar5 != (AHexenArmor *)0x0) {
      if (pAVar5->Slots[iVar2] <= 0.0) {
        return;
      }
      if (pAVar5->SlotsIncrement[iVar2] <= 0.0) {
        return;
      }
      dVar6 = MIN<double>(1.0,pAVar5->Slots[iVar2] / pAVar5->SlotsIncrement[iVar2]);
      this->alpha = dVar6 * this->alpha;
      pFVar3 = FImageCollection::operator[](&statusBar->Images,this->image);
      this->texture = pFVar3;
    }
  }
  else if (*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 10) {
    pFVar3 = FTextureManager::operator()(&TexMan,(FTextureID)(this->sprite).texnum,false);
    this->texture = pFVar3;
  }
  else if ((*(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34 == 0xc) &&
          (bVar1 = TObjPtr<AInventory>::operator!=
                             (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel,
                              (AInventory *)0x0), bVar1)) {
    pAVar4 = TObjPtr<AInventory>::operator->
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
    pFVar3 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar4->Icon).texnum,false);
    this->texture = pFVar3;
  }
  else if (-1 < this->image) {
    pFVar3 = FImageCollection::operator[](&statusBar->Images,this->image);
    this->texture = pFVar3;
  }
  if ((this->flags & 0x80) != 0) {
    local_79 = true;
    if (this->texture != (FTexture *)0x0) {
      local_79 = this->texture->UseType == '\r';
    }
    SBarInfoCommandFlowControl::SetTruth
              (&this->super_SBarInfoCommandFlowControl,local_79,block,statusBar);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			texture = NULL;
			alpha = 1.;
			if (applyscale)
			{
				spawnScaleX = spawnScaleY = 1.0f;
				applyscale = false;
			}
			if(type == PLAYERICON)
				texture = TexMan(statusBar->CPlayer->mo->ScoreIcon);
			else if(type == AMMO1)
			{
				AAmmo *ammo = statusBar->ammo1;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == AMMO2)
			{
				AAmmo *ammo = statusBar->ammo2;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == ARMOR)
			{
				ABasicArmor *armor = statusBar->armor;
				if(armor != NULL && armor->Amount != 0)
					GetIcon(armor);
			}
			else if(type == WEAPONICON)
			{
				AWeapon *weapon = statusBar->CPlayer->ReadyWeapon;
				if(weapon != NULL)
					GetIcon(weapon);
			}
			else if(type == SIGIL)
			{
				AInventory *item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
				if (item != NULL)
					texture = TexMan(item->Icon);
			}
			else if(type == HEXENARMOR_ARMOR || type == HEXENARMOR_SHIELD || type == HEXENARMOR_HELM || type == HEXENARMOR_AMULET)
			{
				int armorType = type - HEXENARMOR_ARMOR;
			
				AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
				if (harmor != NULL)
				{
					if (harmor->Slots[armorType] > 0 && harmor->SlotsIncrement[armorType] > 0)
					{
						//combine the alpha values
						alpha *= MIN(1., harmor->Slots[armorType] / harmor->SlotsIncrement[armorType]);
						texture = statusBar->Images[image];
					}
					else
						return;
				}
			}
			else if(type == INVENTORYICON)
				texture = TexMan(sprite);
			else if(type == SELECTEDINVENTORYICON && statusBar->CPlayer->mo->InvSel != NULL)
				texture = TexMan(statusBar->CPlayer->mo->InvSel->Icon);
			else if(image >= 0)
				texture = statusBar->Images[image];
			
			if (flags & DI_ALTERNATEONFAIL)
			{
				SetTruth(texture == NULL || texture->UseType == FTexture::TEX_Null, block, statusBar);
			}
		}